

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O0

FScanner * __thiscall FScanner::operator=(FScanner *this,FScanner *other)

{
  char *pcVar1;
  FScanner *other_local;
  FScanner *this_local;
  
  if (this != other) {
    if ((other->ScriptOpen & 1U) == 0) {
      Close(this);
    }
    else {
      this->ScriptOpen = true;
      FString::operator=(&this->ScriptName,&other->ScriptName);
      FString::operator=(&this->ScriptBuffer,&other->ScriptBuffer);
      this->ScriptPtr = other->ScriptPtr;
      this->ScriptEndPtr = other->ScriptEndPtr;
      this->AlreadyGot = (bool)(other->AlreadyGot & 1);
      this->AlreadyGotLine = other->AlreadyGotLine;
      this->LastGotToken = (bool)(other->LastGotToken & 1);
      this->LastGotPtr = other->LastGotPtr;
      this->LastGotLine = other->LastGotLine;
      this->CMode = (bool)(other->CMode & 1);
      this->Escape = (bool)(other->Escape & 1);
      this->StateMode = other->StateMode;
      this->StateOptions = (bool)(other->StateOptions & 1);
      if (other->String == other->StringBuffer) {
        memcpy(this->StringBuffer,other->StringBuffer,0x80);
        FString::operator=(&this->BigStringBuffer,"");
        this->String = this->StringBuffer;
      }
      else {
        FString::operator=(&this->BigStringBuffer,&other->BigStringBuffer);
        pcVar1 = FString::LockBuffer(&this->BigStringBuffer);
        this->String = pcVar1;
      }
      this->StringLen = other->StringLen;
      this->TokenType = other->TokenType;
      this->Number = other->Number;
      this->Float = other->Float;
      FName::operator=(&this->Name,&other->Name);
      this->Line = other->Line;
      this->End = (bool)(other->End & 1);
      this->Crossed = (bool)(other->Crossed & 1);
    }
  }
  return this;
}

Assistant:

FScanner &FScanner::operator=(const FScanner &other)
{
	if (this == &other)
	{
		return *this;
	}
	if (!other.ScriptOpen)
	{
		Close();
		return *this;
	}

	// Copy protected members
	ScriptOpen = true;
	ScriptName = other.ScriptName;
	ScriptBuffer = other.ScriptBuffer;
	ScriptPtr = other.ScriptPtr;
	ScriptEndPtr = other.ScriptEndPtr;
	AlreadyGot = other.AlreadyGot;
	AlreadyGotLine = other.AlreadyGotLine;
	LastGotToken = other.LastGotToken;
	LastGotPtr = other.LastGotPtr;
	LastGotLine = other.LastGotLine;
	CMode = other.CMode;
	Escape = other.Escape;
	StateMode = other.StateMode;
	StateOptions = other.StateOptions;

	// Copy public members
	if (other.String == other.StringBuffer)
	{
		memcpy(StringBuffer, other.StringBuffer, sizeof(StringBuffer));
		BigStringBuffer = "";
		String = StringBuffer;
	}
	else
	{
		// Past practice means the string buffer must be writeable, which
		// removes some of the benefit from using an FString to store
		// the big string buffer.
		BigStringBuffer = other.BigStringBuffer;
		String = BigStringBuffer.LockBuffer();
	}
	StringLen = other.StringLen;
	TokenType = other.TokenType;
	Number = other.Number;
	Float = other.Float;
	Name = other.Name;
	Line = other.Line;
	End = other.End;
	Crossed = other.Crossed;

	return *this;
}